

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O2

bool __thiscall
ObjectModelBuilder::buildFunction(ObjectModelBuilder *this,string *functionString,Class *clazz)

{
  ostream *poVar1;
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 local_48 [8];
  string function;
  
  string_trim((string *)local_48,functionString);
  local_68._M_p = (pointer)&local_58;
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_70 = (undefined1  [8])clazz;
  std::__cxx11::string::_M_assign((string *)&local_68);
  std::vector<Function,_std::allocator<Function>_>::push_back
            (&clazz->functions,(value_type *)local_70);
  if (this->m_verbose == true) {
    poVar1 = std::operator<<((ostream *)&std::cerr," - function: \'");
    poVar1 = std::operator<<(poVar1,(string *)local_48);
    poVar1 = std::operator<<(poVar1,"\'");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)local_48);
  return true;
}

Assistant:

bool ObjectModelBuilder::buildFunction(const std::string &functionString, Class *clazz)
{
    std::string function = string_trim(functionString);

    Function f;
    f.clazz = clazz;
    f.signature = function;
    clazz->functions.push_back(f);

    if (m_verbose)
        std::cerr << " - function: '" << function << "'" << std::endl;

    return true;
}